

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O2

char * str_unescape(char *str)

{
  char cVar1;
  char *pcVar2;
  size_t __n;
  size_t len;
  char *pcVar3;
  char *__s;
  
  __s = str;
  pcVar3 = str;
  while( true ) {
    if (*__s == '\0') {
      return str;
    }
    pcVar2 = strchr(__s,0x5c);
    if (pcVar2 < __s) break;
    memmove(pcVar3,__s,(long)pcVar2 - (long)__s);
    cVar1 = pcVar2[1];
    if (cVar1 == 't') {
      cVar1 = '\t';
    }
    else if (cVar1 == 'r') {
      cVar1 = '\r';
    }
    else if (cVar1 == 'n') {
      cVar1 = '\n';
    }
    pcVar3 = pcVar3 + ((long)pcVar2 - (long)__s);
    *pcVar3 = cVar1;
    pcVar3[1] = '\0';
    pcVar3 = pcVar3 + 1;
    __s = pcVar2 + 2;
  }
  __n = strlen(__s);
  memmove(pcVar3,__s,__n);
  pcVar3[__n] = '\0';
  return str;
}

Assistant:

char *str_unescape(char *str) {
    char *read = str, *write = str;
    while (*read) {
        char * pos = strchr(read, '\\');
        if (pos >= read) {
            size_t len = (size_t)(pos - read);
            memmove(write, read, len);
            write += len;
            read += (len + 1);
            switch (read[0]) {
            case 'r':
                *write++ = '\r';
                break;
            case 'n':
                *write++ = '\n';
                break;
            case 't':
                *write++ = '\t';
                break;
            default: 
                *write++ = read[0];
            }
            *write = 0;
            ++read;
        }
        else {
            size_t len = strlen(read);
            memmove(write, read, len);
            write[len] = 0;
            break;
        }
    }
    return str;
}